

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uLong cm_zlib_deflateBound(z_streamp strm,uLong sourceLen)

{
  uLong destLen;
  deflate_state *s;
  uLong sourceLen_local;
  z_streamp strm_local;
  
  strm_local = (z_streamp)(sourceLen + (sourceLen + 7 >> 3) + (sourceLen + 0x3f >> 6) + 0xb);
  if ((((strm != (z_streamp)0x0) && (strm->state != (internal_state_conflict1 *)0x0)) &&
      (strm->state->w_bits == 0xf)) && (strm->state->hash_bits == 0xf)) {
    strm_local = (z_streamp)cm_zlib_compressBound(sourceLen);
  }
  return (uLong)strm_local;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong destLen;

    /* conservative upper bound */
    destLen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 11;

    /* if can't get parameters, return conservative bound */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return destLen;

    /* if not default parameters, return conservative bound */
    s = strm->state;
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return destLen;

    /* default settings: return tight bound for that case */
    return compressBound(sourceLen);
}